

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O0

void __thiscall tinyxml2::XMLAttribute::~XMLAttribute(XMLAttribute *this)

{
  XMLAttribute *this_local;
  
  this->_vptr_XMLAttribute = (_func_int **)&PTR__XMLAttribute_00395a70;
  StrPair::~StrPair(&this->_value);
  StrPair::~StrPair(&this->_name);
  return;
}

Assistant:

virtual ~XMLAttribute()	{}